

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffwend(fitsfile *fptr,int *status)

{
  int iVar1;
  int *in_RSI;
  long in_RDI;
  char keyrec [81];
  char endkey [81];
  char blankkey [81];
  long nspace;
  LONGLONG endpos;
  int tstatus;
  int ii;
  long local_158;
  int *in_stack_fffffffffffffeb0;
  char local_148 [4];
  int in_stack_fffffffffffffebc;
  LONGLONG in_stack_fffffffffffffec0;
  fitsfile *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffef0;
  void *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  fitsfile *in_stack_ffffffffffffff08;
  LONGLONG in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  char local_88 [88];
  long local_30;
  int *local_28;
  int local_20;
  int local_1c;
  int *local_18;
  long local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_148,0,0x51);
  if (*local_18 < 1) {
    local_28 = *(int **)(*(long *)(local_10 + 8) + 0x70);
    if (*(long *)(*(long *)(local_10 + 8) + 0x88) == -1) {
      *(long *)(*(long *)(local_10 + 8) + 0x88) = ((long)local_28 / 0xb40 + 1) * 0xb40;
    }
    local_30 = (*(long *)(*(long *)(local_10 + 8) + 0x88) - (long)local_28) / 0x50;
    strcpy(local_88,"                                        ");
    strcat(local_88,"                                        ");
    strcpy(&stack0xffffffffffffff18,"END                                     ");
    strcat(&stack0xffffffffffffff18,"                                        ");
    local_20 = 0;
    ffmbyt(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
           in_stack_fffffffffffffeb0);
    local_1c = 0;
    while (((local_1c < local_30 &&
            (ffgbyt(in_stack_ffffffffffffff08,(LONGLONG)in_stack_ffffffffffffff00,
                    in_stack_fffffffffffffef8,in_stack_fffffffffffffef0), local_20 == 0)) &&
           ((iVar1 = strncmp(local_148,local_88,0x50), iVar1 == 0 ||
            (iVar1 = strncmp(local_148,&stack0xffffffffffffff18,0x50), iVar1 == 0))))) {
      local_1c = local_1c + 1;
    }
    if ((local_1c == local_30) && (local_20 == 0)) {
      in_stack_fffffffffffffeb0 = local_28;
      if ((long)local_28 <= *(long *)(*(long *)(local_10 + 8) + 0x88) + -0xb40) {
        in_stack_fffffffffffffeb0 = (int *)(*(long *)(*(long *)(local_10 + 8) + 0x88) + -0xb40);
      }
      local_28 = in_stack_fffffffffffffeb0;
      ffmbyt(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             in_stack_fffffffffffffeb0);
      ffgbyt(in_stack_ffffffffffffff08,(LONGLONG)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
             ,in_stack_fffffffffffffef0);
      iVar1 = strncmp(local_148,&stack0xffffffffffffff18,0x50);
      if ((iVar1 == 0) && (local_20 == 0)) {
        *(int **)(*(long *)(local_10 + 8) + 0x78) = local_28;
        return *local_18;
      }
    }
    local_28 = *(int **)(*(long *)(local_10 + 8) + 0x70);
    ffmbyt(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
           in_stack_fffffffffffffeb0);
    for (local_1c = 0; local_1c < local_30; local_1c = local_1c + 1) {
      ffpbyt(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00);
    }
    if (*(long *)(*(long *)(local_10 + 8) + 0x88) + -0xb40 < (long)local_28) {
      local_158 = (long)local_28;
    }
    else {
      local_158 = *(long *)(*(long *)(local_10 + 8) + 0x88) + -0xb40;
    }
    local_28 = (int *)local_158;
    ffmbyt(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
           in_stack_fffffffffffffeb0);
    ffpbyt(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
           in_stack_ffffffffffffff00);
    *(int **)(*(long *)(local_10 + 8) + 0x78) = local_28;
    if (0 < *local_18) {
      ffpmsg((char *)0x171a80);
    }
    local_4 = *local_18;
  }
  else {
    local_4 = *local_18;
  }
  return local_4;
}

Assistant:

int ffwend(fitsfile *fptr,       /* I - FITS file pointer */
            int *status)         /* IO - error status     */
/*
  write the END card and following fill (space chars) in the current header
*/
{
    int ii, tstatus;
    LONGLONG endpos;
    long nspace;
    char blankkey[FLEN_CARD], endkey[FLEN_CARD], keyrec[FLEN_CARD] = "";

    if (*status > 0)
        return(*status);

    endpos = (fptr->Fptr)->headend;

    /* we assume that the HDUposition == curhdu in all cases */

    /*  calc the data starting position if not currently defined */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        (fptr->Fptr)->datastart = ( endpos / 2880 + 1 ) * 2880;

    /* calculate the number of blank keyword slots in the header */
    nspace = (long) (( (fptr->Fptr)->datastart - endpos ) / 80);

    /* construct a blank and END keyword (80 spaces )  */
    strcpy(blankkey, "                                        ");
    strcat(blankkey, "                                        ");
    strcpy(endkey, "END                                     ");
    strcat(endkey, "                                        ");
  
    /* check if header is already correctly terminated with END and fill */
    tstatus=0;
    ffmbyt(fptr, endpos, REPORT_EOF, &tstatus); /* move to header end */
    for (ii=0; ii < nspace; ii++)
    {
        ffgbyt(fptr, 80, keyrec, &tstatus);  /* get next keyword */
        if (tstatus) break;
        if (strncmp(keyrec, blankkey, 80) && strncmp(keyrec, endkey, 80))
            break;
    }

    if (ii == nspace && !tstatus)
    {
        /* check if the END keyword exists at the correct position */
        endpos=maxvalue( endpos, ( (fptr->Fptr)->datastart - 2880 ) );
        ffmbyt(fptr, endpos, REPORT_EOF, &tstatus);  /* move to END position */
        ffgbyt(fptr, 80, keyrec, &tstatus); /* read the END keyword */
        if ( !strncmp(keyrec, endkey, 80) && !tstatus) {

            /* store this position, for later reference */
            (fptr->Fptr)->ENDpos = endpos;

            return(*status);    /* END card was already correct */
         }
    }

    /* header was not correctly terminated, so write the END and blank fill */
    endpos = (fptr->Fptr)->headend;
    ffmbyt(fptr, endpos, IGNORE_EOF, status); /* move to header end */
    for (ii=0; ii < nspace; ii++)
        ffpbyt(fptr, 80, blankkey, status);  /* write the blank keywords */

    /*
    The END keyword must either be placed immediately after the last
    keyword that was written (as indicated by the headend value), or
    must be in the first 80 bytes of the 2880-byte FITS record immediately 
    preceeding the data unit, whichever is further in the file. The
    latter will occur if space has been reserved for more header keywords
    which have not yet been written.
    */

    endpos=maxvalue( endpos, ( (fptr->Fptr)->datastart - 2880 ) );
    ffmbyt(fptr, endpos, REPORT_EOF, status);  /* move to END position */

    ffpbyt(fptr, 80, endkey, status); /*  write the END keyword to header */
    
    /* store this position, for later reference */
    (fptr->Fptr)->ENDpos = endpos;

    if (*status > 0)
        ffpmsg("Error while writing END card (ffwend).");

    return(*status);
}